

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

char * lyd_path(lyd_node *node,LYD_PATH_TYPE pathtype,char *buffer,size_t buflen)

{
  lysc_node *plVar1;
  lyd_node_inner *plVar2;
  size_t sVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  LY_ERR LVar7;
  lys_module *plVar8;
  lys_module *plVar9;
  size_t sVar10;
  uint uVar11;
  char **ppcVar12;
  char *pcVar13;
  lyd_node_inner *node_00;
  lys_module *plVar14;
  ly_ctx *ctx;
  lyd_node_inner *plVar15;
  ly_bool is_static;
  char *pcVar16;
  long lVar17;
  ulong size;
  bool bVar18;
  size_t bufused;
  char *local_60;
  size_t local_58;
  size_t local_50;
  LYD_PATH_TYPE local_44;
  lyd_node_inner *local_40;
  char *local_38;
  
  local_50 = 0;
  local_60 = buffer;
  local_58 = buflen;
  local_44 = pathtype;
  if (node == (lyd_node *)0x0) {
    pcVar16 = "node";
    ctx = (ly_ctx *)0x0;
LAB_00123636:
    ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar16,"lyd_path");
    buffer = (char *)0x0;
  }
  else {
    if (buffer == (char *)0x0) {
      local_58 = 0;
      is_static = '\0';
    }
    else {
      is_static = '\x01';
      if (buflen < 2) {
        if (node->schema == (lysc_node *)0x0) {
          plVar8 = (lys_module *)&node[2].schema;
        }
        else {
          plVar8 = node->schema->module;
        }
        ctx = plVar8->ctx;
        pcVar16 = "buflen > 1";
        goto LAB_00123636;
      }
    }
    if (pathtype < 2) {
      uVar4 = 1;
      plVar15 = node->parent;
      node_00 = (lyd_node_inner *)node;
      while (plVar2 = plVar15, local_40 = (lyd_node_inner *)node, local_38 = buffer,
            plVar2 != (lyd_node_inner *)0x0) {
        uVar4 = uVar4 + 1;
        node_00 = plVar2;
        plVar15 = (plVar2->field_0).node.parent;
      }
      do {
        uVar5 = uVar4;
        plVar8 = lyd_node_module((lyd_node *)node_00);
        if (node_00 == (lyd_node_inner *)0x0) {
          plVar15 = (lyd_node_inner *)0x0;
        }
        else {
          plVar15 = *(lyd_node_inner **)((long)&node_00->field_0 + 0x10);
        }
        plVar9 = lyd_node_module((lyd_node *)plVar15);
        plVar14 = (lys_module *)0x0;
        if (plVar9 != plVar8) {
          plVar14 = plVar8;
        }
        if (plVar14 == (lys_module *)0x0) {
          lVar17 = 2;
        }
        else {
          sVar10 = strlen(plVar14->name);
          lVar17 = sVar10 + 3;
        }
        ppcVar12 = &(*(lysc_node **)((long)&node_00->field_0 + 8))->name;
        if (*(lysc_node **)((long)&node_00->field_0 + 8) == (lysc_node *)0x0) {
          ppcVar12 = (char **)&node_00->children_ht;
        }
        sVar10 = strlen(*ppcVar12);
        sVar3 = local_50;
        size = lVar17 + local_50 + sVar10;
        if ((local_38 == (char *)0x0) && (local_58 < size)) {
          local_60 = (char *)ly_realloc(local_60,size);
          local_58 = size;
          if (local_60 == (char *)0x0) {
            return (char *)0x0;
          }
        }
        else if (local_58 < size) {
          return local_60;
        }
        pcVar16 = "";
        pcVar13 = "";
        if (plVar14 != (lys_module *)0x0) {
          pcVar16 = plVar14->name;
          pcVar13 = ":";
        }
        bVar18 = local_44 == LYD_PATH_STD;
        ppcVar12 = &(*(lysc_node **)((long)&node_00->field_0 + 8))->name;
        if (*(lysc_node **)((long)&node_00->field_0 + 8) == (lysc_node *)0x0) {
          ppcVar12 = (char **)&node_00->children_ht;
        }
        LVar7 = LY_SUCCESS;
        iVar6 = sprintf(local_60 + sVar3,"/%s%s%s",pcVar16,pcVar13,*ppcVar12);
        local_50 = (long)iVar6 + sVar3;
        plVar1 = *(lysc_node **)((long)&node_00->field_0 + 8);
        if ((plVar1 != (lysc_node *)0x0) && (bVar18 || 1 < uVar5)) {
          if (plVar1->nodetype == 8) {
            if ((plVar1->flags & 1) == 0) {
LAB_00123593:
              LVar7 = lyd_path_position_predicate
                                ((lyd_node *)node_00,&local_60,&local_58,&local_50,is_static);
            }
            else {
              LVar7 = lyd_path_leaflist_predicate
                                ((lyd_node *)node_00,&local_60,&local_58,&local_50,is_static);
            }
          }
          else if (plVar1->nodetype == 0x10) {
            if ((plVar1->flags & 0x200) != 0) goto LAB_00123593;
            LVar7 = lyd_path_list_predicate
                              ((lyd_node *)node_00,&local_60,&local_58,&local_50,is_static);
          }
        }
        if (LVar7 != LY_SUCCESS) {
          return local_60;
        }
        node_00 = local_40;
        uVar4 = uVar5 - 1;
        if (uVar5 != 2) {
          if (uVar5 == 1) {
            return local_60;
          }
          uVar11 = 2;
          do {
            if (node_00 == (lyd_node_inner *)0x0) {
              node_00 = (lyd_node_inner *)0x0;
            }
            else {
              node_00 = (node_00->field_0).node.parent;
            }
            uVar11 = uVar11 + 1;
          } while (uVar5 != uVar11);
        }
      } while( true );
    }
  }
  return buffer;
}

Assistant:

LIBYANG_API_DEF char *
lyd_path(const struct lyd_node *node, LYD_PATH_TYPE pathtype, char *buffer, size_t buflen)
{
    ly_bool is_static = 0;
    uint32_t i, depth;
    size_t bufused = 0, len;
    const struct lyd_node *iter, *parent;
    const struct lys_module *mod, *prev_mod;
    LY_ERR rc = LY_SUCCESS;

    LY_CHECK_ARG_RET(NULL, node, NULL);
    if (buffer) {
        LY_CHECK_ARG_RET(LYD_CTX(node), buflen > 1, NULL);
        is_static = 1;
    } else {
        buflen = 0;
    }

    switch (pathtype) {
    case LYD_PATH_STD:
    case LYD_PATH_STD_NO_LAST_PRED:
        depth = 1;
        for (iter = node; iter->parent; iter = lyd_parent(iter)) {
            ++depth;
        }

        goto iter_print;
        while (depth) {
            /* find the right node */
            for (iter = node, i = 1; i < depth; iter = lyd_parent(iter), ++i) {}
iter_print:
            /* get the module */
            mod = lyd_node_module(iter);
            parent = lyd_parent(iter);
            prev_mod = lyd_node_module(parent);
            if (prev_mod == mod) {
                mod = NULL;
            }

            /* realloc string */
            len = 1 + (mod ? strlen(mod->name) + 1 : 0) + (iter->schema ? strlen(iter->schema->name) :
                    strlen(((struct lyd_node_opaq *)iter)->name.name));
            rc = lyd_path_str_enlarge(&buffer, &buflen, bufused + len, is_static);
            if (rc != LY_SUCCESS) {
                break;
            }

            /* print next node */
            bufused += sprintf(buffer + bufused, "/%s%s%s", mod ? mod->name : "", mod ? ":" : "", LYD_NAME(iter));

            /* do not always print the last (first) predicate */
            if (iter->schema && ((depth > 1) || (pathtype == LYD_PATH_STD))) {
                switch (iter->schema->nodetype) {
                case LYS_LIST:
                    if (iter->schema->flags & LYS_KEYLESS) {
                        /* print its position */
                        rc = lyd_path_position_predicate(iter, &buffer, &buflen, &bufused, is_static);
                    } else {
                        /* print all list keys in predicates */
                        rc = lyd_path_list_predicate(iter, &buffer, &buflen, &bufused, is_static);
                    }
                    break;
                case LYS_LEAFLIST:
                    if (iter->schema->flags & LYS_CONFIG_W) {
                        /* print leaf-list value */
                        rc = lyd_path_leaflist_predicate(iter, &buffer, &buflen, &bufused, is_static);
                    } else {
                        /* print its position */
                        rc = lyd_path_position_predicate(iter, &buffer, &buflen, &bufused, is_static);
                    }
                    break;
                default:
                    /* nothing to print more */
                    break;
                }
            }
            if (rc != LY_SUCCESS) {
                break;
            }

            --depth;
        }
        break;
    }

    return buffer;
}